

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall
ary::PlaneTracker::initialize
          (PlaneTracker *this,Mat *image,SharedPlanarLocalization *localization,int id)

{
  float fVar1;
  PlanarLocalization *pPVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  _OutputArray *p_Var6;
  CameraModel *pCVar7;
  undefined1 local_2f8 [112];
  undefined1 local_288 [52];
  Point_<float> local_254;
  value_type local_24c;
  int local_240;
  undefined1 local_23c [4];
  int i_1;
  Matx31f p;
  _OutputArray local_218;
  Matx<float,_3,_1> local_200 [2];
  _InputArray local_1e8;
  undefined1 local_1d0 [8];
  Matx31f translation;
  Matx33f rotation;
  _OutputArray local_188;
  _InputArray local_170;
  Point_<int> local_158;
  Scalar_<double> local_150;
  _InputOutputArray local_130;
  reference local_118;
  Point *mask_points_ptr;
  int local_108;
  undefined4 local_104;
  int i;
  int mask_npoints;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> mask_points;
  _InputArray local_e0;
  MatSize local_c8;
  undefined1 local_c0 [16];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_b0;
  Mat local_88;
  int local_24;
  SharedPlanarLocalization *pSStack_20;
  int id_local;
  SharedPlanarLocalization *localization_local;
  Mat *image_local;
  PlaneTracker *this_local;
  
  local_24 = id;
  pSStack_20 = localization;
  localization_local = (SharedPlanarLocalization *)image;
  image_local = (Mat *)this;
  cv::Mat::clone();
  cv::Mat::operator=(&this->previous,&local_88);
  cv::Mat::~Mat(&local_88);
  pPVar2 = cv::Ptr<ary::PlanarLocalization>::operator->(localization);
  PlanarLocalization::getPlaneCorners(&local_b0,pPVar2);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
            (&this->plane_corners,&local_b0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector(&local_b0);
  cv::Ptr<ary::PlanarLocalization>::operator->(localization);
  PlanarLocalization::getPlaneSize((PlanarLocalization *)local_c0);
  cv::Size_::operator_cast_to_Size_((Size_ *)(local_c0 + 8));
  cv::Size_<int>::operator=(&this->plane_size,(Size_<int> *)(local_c0 + 8));
  cv::MatSize::operator()(&local_c8);
  cv::Mat::create(&this->mask,&local_c8,0);
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::_InputArray::_InputArray
            (&local_e0,
             (double *)
             &mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&this->mask,&local_e0);
  cv::_InputArray::~_InputArray(&local_e0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i);
  sVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                    (&this->plane_corners);
  local_104 = (undefined4)sVar3;
  local_108 = 0;
  while( true ) {
    uVar4 = (ulong)local_108;
    sVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                      (&this->plane_corners);
    if (sVar3 <= uVar4) break;
    pvVar5 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                       (&this->plane_corners,(long)local_108);
    fVar1 = pvVar5->x;
    pvVar5 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                       (&this->plane_corners,(long)local_108);
    cv::Point_<int>::Point_((Point_<int> *)&mask_points_ptr,(int)fVar1,(int)pvVar5->y);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i,
               (value_type *)&mask_points_ptr);
    local_108 = local_108 + 1;
  }
  local_118 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                        ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i,0);
  cv::_InputOutputArray::_InputOutputArray(&local_130,&this->mask);
  cv::Scalar_<double>::Scalar_(&local_150,255.0);
  cv::Point_<int>::Point_(&local_158);
  cv::fillPoly(&local_130,&local_118,&local_104,1,&local_150,8,0,&local_158);
  cv::_InputOutputArray::~_InputOutputArray(&local_130);
  cv::_InputArray::_InputArray(&local_170,(Mat *)localization_local);
  cv::_OutputArray::_OutputArray<cv::Point_<float>>(&local_188,&this->keypoints_current);
  cv::_InputArray::_InputArray((_InputArray *)(rotation.val + 7),&this->mask);
  cv::goodFeaturesToTrack
            (&local_170,&local_188,1000,0.1,2.0,(_InputArray *)(rotation.val + 7),3,false,0.04);
  cv::_InputArray::~_InputArray((_InputArray *)(rotation.val + 7));
  cv::_OutputArray::~_OutputArray(&local_188);
  cv::_InputArray::~_InputArray(&local_170);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::clear
            (&this->keypoints_start);
  cv::Matx<float,_3,_3>::Matx((Matx<float,_3,_3> *)(translation.val + 1));
  cv::Matx<float,_3,_1>::Matx((Matx<float,_3,_1> *)local_1d0);
  pPVar2 = cv::Ptr<ary::PlanarLocalization>::operator->(localization);
  (*(pPVar2->super_Localization)._vptr_Localization[2])(local_200);
  cv::_InputArray::_InputArray<float,3,1>(&local_1e8,local_200);
  cv::_OutputArray::_OutputArray<float,3,3>(&local_218,(Matx<float,_3,_3> *)(translation.val + 1));
  p_Var6 = (_OutputArray *)cv::noArray();
  cv::Rodrigues(&local_1e8,&local_218,p_Var6);
  cv::_OutputArray::~_OutputArray(&local_218);
  cv::_InputArray::~_InputArray(&local_1e8);
  pPVar2 = cv::Ptr<ary::PlanarLocalization>::operator->(localization);
  (*(pPVar2->super_Localization)._vptr_Localization[2])(p.val + 1);
  cv::Matx<float,_3,_1>::Matx((Matx<float,_3,_1> *)local_23c);
  local_240 = 0;
  while( true ) {
    uVar4 = (ulong)local_240;
    sVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                      (&this->keypoints_current);
    if (sVar3 <= uVar4) break;
    pvVar5 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                       (&this->keypoints_current,(long)local_240);
    cv::Point_<float>::Point_(&local_254,pvVar5);
    CameraUser::getCameraModel((CameraUser *)local_288);
    pCVar7 = cv::Ptr<ary::CameraModel>::operator->((Ptr<ary::CameraModel> *)local_288);
    CameraModel::getIntrinsics((Matx33f *)(local_288 + 0x10),pCVar7);
    CameraUser::getCameraModel((CameraUser *)local_2f8);
    pCVar7 = cv::Ptr<ary::CameraModel>::operator->((Ptr<ary::CameraModel> *)local_2f8);
    CameraModel::getDistortion((Mat *)(local_2f8 + 0x10),pCVar7);
    unprojectPoint((ary *)&local_24c,&local_254,(Matx33f *)(translation.val + 1),
                   (Matx31f *)local_1d0,(Matx33f *)(local_288 + 0x10),(Mat *)(local_2f8 + 0x10));
    std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
              (&this->keypoints_start,&local_24c);
    cv::Mat::~Mat((Mat *)(local_2f8 + 0x10));
    cv::Ptr<ary::CameraModel>::~Ptr((Ptr<ary::CameraModel> *)local_2f8);
    cv::Ptr<ary::CameraModel>::~Ptr((Ptr<ary::CameraModel> *)local_288);
    local_240 = local_240 + 1;
  }
  this->age = 0;
  this->identifier = local_24;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i);
  return;
}

Assistant:

void PlaneTracker::initialize(const Mat& image, SharedPlanarLocalization localization, int id) {
	previous = image.clone();

	plane_corners = localization->getPlaneCorners();
	plane_size = localization->getPlaneSize();

	mask.create(previous.size(), CV_8UC1); mask.setTo(0);
	vector<Point> mask_points;
	int mask_npoints = plane_corners.size();
	for (int i = 0; i < plane_corners.size(); i++) {
		mask_points.push_back(Point(plane_corners[i].x, plane_corners[i].y));
	}
	const Point* mask_points_ptr = &(mask_points[0]);

	fillPoly(mask, &mask_points_ptr, &mask_npoints, 1, Scalar(255));
	goodFeaturesToTrack(image, keypoints_current, 1000, 0.1, 2, mask);

	keypoints_start.clear();

	Matx33f rotation;
	Matx31f translation;
	Rodrigues(localization->getCameraPosition().rotation, rotation);
	translation = localization->getCameraPosition().translation;

	Matx31f p;
	for (int i = 0; i < keypoints_current.size(); i++) {
		keypoints_start.push_back(unprojectPoint(keypoints_current[i], rotation, translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion()));
	}
/*
	vector<Point2f> image_points2;
	projectPoints(keypoints_start, camera.rotation, camera.translation, getCamera()->getIntrinsics(), getCamera()->getDistortion(), image_points2);

	Mat test;
	image.copyTo(test);

	for (int i = 0; i < keypoints_start.size(); i++) {
		line(test, image_points2[i], keypoints_current[i], Scalar(255), 2);
	cout <<  keypoints_current[i] << image_points2[i] << keypoints_start[i] << endl;

	}

	imshow("Test", test);
	waitKey(0);*/

    age = 0;
    identifier = id;

}